

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,char *error)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  ErrorCollector *pEVar3;
  bool bVar4;
  int iVar5;
  double dVar6;
  uint64 value;
  long *local_40 [2];
  long local_30 [2];
  uint64 local_20;
  
  pTVar2 = this->input_;
  TVar1 = (pTVar2->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    local_20 = 0;
    bVar4 = io::Tokenizer::ParseInteger(&(pTVar2->current_).text,0xffffffffffffffff,&local_20);
    if (!bVar4) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Integer out of range.","")
      ;
      pEVar3 = this->error_collector_;
      if (pEVar3 != (ErrorCollector *)0x0) {
        (*pEVar3->_vptr_ErrorCollector[2])
                  (pEVar3,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,local_40);
      }
      this->had_errors_ = true;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    *output = ((double)CONCAT44(0x45300000,(int)(local_20 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0);
  }
  else if (TVar1 == TYPE_FLOAT) {
    dVar6 = io::Tokenizer::ParseFloat(&(pTVar2->current_).text);
    *output = dVar6;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&(pTVar2->current_).text);
    if (iVar5 == 0) {
      dVar6 = INFINITY;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar5 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_40,error,(allocator<char> *)&local_20);
        pEVar3 = this->error_collector_;
        if (pEVar3 != (ErrorCollector *)0x0) {
          (*pEVar3->_vptr_ErrorCollector[2])
                    (pEVar3,(ulong)(uint)(this->input_->current_).line,
                     (ulong)(uint)(this->input_->current_).column,local_40);
        }
        this->had_errors_ = true;
        if (local_40[0] != local_30) {
          operator_delete(local_40[0],local_30[0] + 1);
        }
        return false;
      }
      dVar6 = NAN;
    }
    *output = dVar6;
  }
  io::Tokenizer::Next(this->input_);
  return true;
}

Assistant:

bool Parser::ConsumeNumber(double* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64 value = 0;
    if (!io::Tokenizer::ParseInteger(input_->current().text,
                                     kuint64max, &value)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    *output = value;
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}